

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

ProgramSources * deqp::gles3::Performance::anon_unknown_0::Utils::getArithmeticWorkloadShader(void)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  pointer pcVar3;
  ProgramSources *extraout_RAX;
  ProgramSources *extraout_RAX_00;
  ProgramSources *extraout_RAX_01;
  ProgramSources *pPVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_type __dnew;
  size_type __dnew_1;
  value_type local_70;
  size_type local_50;
  value_type local_48;
  
  local_70._M_dataplus._M_p = (pointer)0xc1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_70);
  _Var1._M_p = local_70._M_dataplus._M_p;
  local_48.field_2._M_allocated_capacity = (size_type)local_70._M_dataplus._M_p;
  local_48._M_dataplus._M_p = pcVar3;
  memcpy(pcVar3,
         "#version 300 es\nin highp vec4 a_position;\nout mediump vec3 v_bcoords;\nvoid main()\n{\n\tv_bcoords = vec3(0, 0, 0);\n\tv_bcoords[int(a_position.w)] = 1.0;\n\tgl_Position = vec4(a_position.xyz, 1.0);\n}\n"
         ,0xc1);
  local_48._M_string_length = (size_type)_Var1._M_p;
  pcVar3[_Var1._M_p] = '\0';
  local_50 = 0x170;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_50);
  sVar2 = local_50;
  local_70.field_2._M_allocated_capacity = local_50;
  local_70._M_dataplus._M_p = pcVar3;
  memcpy(pcVar3,
         "#version 300 es\nin mediump vec3 v_bcoords;\nout mediump vec4 fragColor;\nuniform mediump int u_iterations;\nvoid main()\n{\n\tmediump float d = gl_FragCoord.z;\n\tfor (int i = 0; i<u_iterations; i++)\n\t\td = d*sin(d)*sin(d) + d*cos(d)*cos(d);\n\tif (v_bcoords.x < 0.02 || v_bcoords.y < 0.02 || v_bcoords.z < 0.02)\n\t\tfragColor = vec4(1,d,d,1);\n\telse\n\t\tfragColor = vec4(d,0,0,1);\n}\n"
         ,0x170);
  local_70._M_string_length = sVar2;
  pcVar3[sVar2] = '\0';
  memset(in_RDI,0,0xac);
  in_RDI[7].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[7].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&in_RDI[7].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&in_RDI[8].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_RDI,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_RDI + 1,&local_70);
  pPVar4 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    pPVar4 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1));
    pPVar4 = extraout_RAX_01;
  }
  return pPVar4;
}

Assistant:

glu::ProgramSources getArithmeticWorkloadShader (void)
	{
		return glu::makeVtxFragSources(getBaseVertexShader(), getArithmeticWorkloadFragmentShader());
	}